

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductHolder<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
::~CartesianProductHolder
          (CartesianProductHolder<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
           *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(this->generators_).
                     super__Tuple_impl<0UL,_testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
                     .
                     super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
                     .
                     super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>
                     ._M_head_impl.impl_.
                     super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
             + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(this->generators_).
                     super__Tuple_impl<0UL,_testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
                     .
                     super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
                     .
                     super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
                     .
                     super__Head_base<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_false>
                     ._M_head_impl.impl_ + 8));
  return;
}

Assistant:

CartesianProductHolder(const Gen&... g) : generators_(g...) {}